

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

uint pageant_client_op_query(PageantClientOp *pco)

{
  byte bVar1;
  BinarySource *pBVar2;
  PageantAsyncOp *pao_00;
  ptrlen pVar3;
  uint local_9c;
  uint reply_type;
  PageantAsyncOp *pao;
  strbuf *psStack_68;
  PageantClientRequestId reqid;
  PageantInternalClient pic;
  int local_1c;
  void *pvStack_18;
  int resplen_raw;
  void *response_raw;
  PageantClientOp *pco_local;
  
  response_raw = pco;
  if ((pco->request_made & 1U) != 0) {
    __assert_fail("!pco->request_made",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/pageant.c",
                  0x700,"unsigned int pageant_client_op_query(PageantClientOp *)");
  }
  pco->request_made = true;
  if ((pageant_local & 1U) == 0) {
    agent_query_synchronous(pco->buf,&stack0xffffffffffffffe8,&local_1c);
    strbuf_clear(*response_raw);
    BinarySink_put_data((BinarySink *)(*response_raw + 0x18),pvStack_18,(long)local_1c);
    safefree(pvStack_18);
    pBVar2 = (BinarySource *)((long)response_raw + 0x18);
    pVar3 = ptrlen_from_strbuf(*response_raw);
    BinarySource_INIT__(pBVar2,pVar3);
    pBVar2 = (BinarySource *)((long)response_raw + 0x18);
    join_0x00000010_0x00000000_ =
         BinarySource_get_string((BinarySource *)((long)response_raw + 0x18));
    BinarySource_INIT__(pBVar2,join_0x00000010_0x00000000_);
  }
  else {
    pic._8_8_ = &internal_clientvt;
    pic.pc.info._0_1_ = 1;
    psStack_68 = pco->buf;
    pic.response._0_1_ = 0;
    pageant_register_client((PageantClient *)&pic.got_response);
    if (*(ulong *)(*response_raw + 0x10) < 5) {
      __assert_fail("pco->buf->len > 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/pageant.c",
                    0x71b,"unsigned int pageant_client_op_query(PageantClientOp *)");
    }
    pVar3 = make_ptrlen((void *)(**response_raw + 4),*(long *)(*response_raw + 0x10) - 4);
    pao_00 = pageant_make_op((PageantClient *)&pic.got_response,
                             (PageantClientRequestId *)((long)&pao + 4),pVar3);
    while ((((byte)pic.response ^ 0xff) & 1) != 0) {
      pageant_async_op_coroutine(pao_00);
    }
    pageant_unregister_client((PageantClient *)&pic.got_response);
    pBVar2 = (BinarySource *)((long)response_raw + 0x18);
    pVar3 = ptrlen_from_strbuf(*response_raw);
    BinarySource_INIT__(pBVar2,pVar3);
  }
  bVar1 = BinarySource_get_byte((BinarySource *)((long)response_raw + 0x18));
  local_9c = (uint)bVar1;
  if (*(int *)((long)response_raw + 0x30) != 0) {
    local_9c = 0x100;
  }
  return local_9c;
}

Assistant:

static unsigned pageant_client_op_query(PageantClientOp *pco)
{
    /* Since we use the same strbuf for the request and the response,
     * check by assertion that we aren't embarrassingly sending a
     * previous response back to the agent */
    assert(!pco->request_made);
    pco->request_made = true;

    if (!pageant_local) {
        void *response_raw;
        int resplen_raw;
        agent_query_synchronous(pco->buf, &response_raw, &resplen_raw);
        strbuf_clear(pco->buf);
        put_data(pco->buf, response_raw, resplen_raw);
        sfree(response_raw);

        /* The data coming back from agent_query_synchronous will have
         * its length field prepended. So we start by parsing it as an
         * SSH-formatted string, and then reinitialise our
         * BinarySource with the interior of that string. */
        BinarySource_INIT_PL(pco, ptrlen_from_strbuf(pco->buf));
        BinarySource_INIT_PL(pco, get_string(pco));
    } else {
        PageantInternalClient pic;
        PageantClientRequestId reqid;

        pic.pc.vt = &internal_clientvt;
        pic.pc.suppress_logging = true;
        pic.response = pco->buf;
        pic.got_response = false;
        pageant_register_client(&pic.pc);

        assert(pco->buf->len > 4);
        PageantAsyncOp *pao = pageant_make_op(
            &pic.pc, &reqid, make_ptrlen(pco->buf->s + 4, pco->buf->len - 4));
        while (!pic.got_response)
            pageant_async_op_coroutine(pao);

        pageant_unregister_client(&pic.pc);

        BinarySource_INIT_PL(pco, ptrlen_from_strbuf(pco->buf));
    }

    /* Strip off and directly return the type byte, which every client
     * will need, to save a boilerplate get_byte at each call site */
    unsigned reply_type = get_byte(pco);
    if (get_err(pco))
        reply_type = 256;              /* out-of-range code */
    return reply_type;
}